

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatbase.c
# Opt level: O0

int ecx_LWR(ecx_portt *port,uint32 LogAdr,uint16 length,void *data,int timeout)

{
  uint uVar1;
  int iVar2;
  int wkc;
  uint8 idx;
  int timeout_local;
  void *data_local;
  uint16 length_local;
  uint32 LogAdr_local;
  ecx_portt *port_local;
  
  uVar1 = ecx_getindex(port);
  ecx_setupdatagram(port,port->txbuf + (byte)uVar1,'\v',(byte)uVar1,(uint16)LogAdr,
                    (uint16)(LogAdr >> 0x10),length,data);
  iVar2 = ecx_srconfirm(port,uVar1 & 0xff,timeout);
  ecx_setbufstat(port,uVar1 & 0xff,0);
  return iVar2;
}

Assistant:

int ecx_LWR(ecx_portt *port, uint32 LogAdr, uint16 length, void *data, int timeout)
{
   uint8 idx;
   int wkc;

   idx = ecx_getindex(port);
   ecx_setupdatagram(port, &(port->txbuf[idx]), EC_CMD_LWR, idx, LO_WORD(LogAdr), HI_WORD(LogAdr), length, data);
   wkc = ecx_srconfirm(port, idx, timeout);
   ecx_setbufstat(port, idx, EC_BUF_EMPTY);

   return wkc;
}